

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O1

void R_InitSprites(void)

{
  TArray<int,_int> *this;
  BYTE BVar1;
  BYTE BVar2;
  PClassPlayerPawn *pPVar3;
  BYTE *pBVar4;
  size_t sVar5;
  FString __src;
  int iVar6;
  FPlayerSkin *pFVar7;
  spritedef_t *psVar8;
  BYTE *pBVar9;
  uint uVar10;
  char *palname;
  ulong uVar11;
  FString classface;
  int lastlump;
  FString local_40;
  int local_34;
  
  palname = "SPALDOOM";
  if (gameinfo.gametype == GAME_DoomChex) {
    palname = "SPALHTIC";
  }
  R_CreateSkinTranslation(palname);
  numskins = (size_t)PlayerClasses.Count;
  local_34 = 0;
  iVar6 = FWadCollection::FindLump(&Wads,"S_SKIN",&local_34,true);
  if (iVar6 != -1) {
    do {
      numskins = numskins + 1;
      iVar6 = FWadCollection::FindLump(&Wads,"S_SKIN",&local_34,true);
    } while (iVar6 != -1);
  }
  if (skins != (FPlayerSkin *)0x0) {
    operator_delete__(skins);
  }
  sVar5 = numskins;
  uVar11 = numskins << 6;
  pFVar7 = (FPlayerSkin *)operator_new__(-(ulong)(numskins >> 0x3a != 0) | uVar11);
  skins = pFVar7;
  memset(pFVar7,0,uVar11);
  if (sVar5 != 0) {
    pPVar3 = (PlayerClasses.Array)->Type;
    BVar1 = pPVar3->ColorRangeStart;
    BVar2 = pPVar3->ColorRangeEnd;
    pBVar4 = (pPVar3->super_PClassActor).super_PClass.Defaults;
    pBVar9 = &pFVar7->range0start;
    uVar10 = 1;
    do {
      *pBVar9 = BVar1;
      pBVar9[1] = BVar2;
      *(double *)(pBVar9 + 0x12) = *(double *)(pBVar4 + 0x100);
      ((DVector2 *)(pBVar9 + 10))->X = *(double *)(pBVar4 + 0xf8);
      uVar11 = (ulong)uVar10;
      pBVar9 = pBVar9 + 0x40;
      uVar10 = uVar10 + 1;
    } while (uVar11 < sVar5);
  }
  R_InitSpriteDefs();
  R_InitVoxels();
  NumStdSprites = sprites.Count;
  R_InitSkins();
  if (PlayerClasses.Count != 0) {
    uVar11 = 0;
    do {
      pPVar3 = PlayerClasses.Array[uVar11].Type;
      FString::AttachToOther(&local_40,&pPVar3->Face);
      __src.Chars = local_40.Chars;
      pFVar7 = skins;
      skins[uVar11].name[4] = '\0';
      builtin_strncpy(pFVar7[uVar11].name,"Base",4);
      if ((*(int *)(local_40.Chars + -0xc) == 0) ||
         (iVar6 = strcmp(local_40.Chars,"None"), iVar6 == 0)) {
        skins[uVar11].face[0] = 'S';
        skins[uVar11].face[1] = 'T';
        skins[uVar11].face[2] = 'F';
        skins[uVar11].face[3] = '\0';
      }
      else {
        strcpy(skins[uVar11].face,__src.Chars);
      }
      pFVar7 = skins;
      skins[uVar11].range0start = pPVar3->ColorRangeStart;
      pFVar7[uVar11].range0end = pPVar3->ColorRangeEnd;
      pBVar4 = (pPVar3->super_PClassActor).super_PClass.Defaults;
      pFVar7[uVar11].Scale.Y = *(double *)(pBVar4 + 0x100);
      pFVar7[uVar11].Scale.X = *(double *)(pBVar4 + 0xf8);
      pFVar7[uVar11].sprite = *(int *)(*(long *)(pBVar4 + 0x448) + 0x10);
      pFVar7[uVar11].namespc = 0;
      this = &PlayerClasses.Array[uVar11].Skins;
      TArray<int,_int>::Grow(this,1);
      this->Array[this->Count] = (int)uVar11;
      this->Count = this->Count + 1;
      if ((sprites.Array[skins[uVar11].sprite].field_0.dwName == 0x59414c50) && (sprites.Count != 0)
         ) {
        uVar10 = 0;
        psVar8 = sprites.Array;
        do {
          if ((psVar8->field_0).dwName == deh.PlayerSprite._0_4_) {
            skins[uVar11].sprite = uVar10;
            break;
          }
          uVar10 = uVar10 + 1;
          psVar8 = psVar8 + 1;
        } while (sprites.Count != uVar10);
      }
      FString::~FString(&local_40);
      uVar11 = uVar11 + 1;
    } while (uVar11 < PlayerClasses.Count);
  }
  return;
}

Assistant:

void R_InitSprites ()
{
	int lump, lastlump;
	unsigned int i, j;

	// [RH] Create a standard translation to map skins between Heretic and Doom
	if (gameinfo.gametype == GAME_DoomChex)
	{
		R_CreateSkinTranslation ("SPALHTIC");
	}
	else
	{
		R_CreateSkinTranslation ("SPALDOOM");
	}

	// [RH] Count the number of skins.
	numskins = PlayerClasses.Size ();
	lastlump = 0;
	while ((lump = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		numskins++;
	}

	// [RH] Do some preliminary setup
	if (skins != NULL) delete [] skins;
	skins = new FPlayerSkin[numskins];
	memset (skins, 0, sizeof(*skins) * numskins);
	for (i = 0; i < numskins; i++)
	{ // Assume Doom skin by default
		PClassPlayerPawn *type = PlayerClasses[0].Type;
		skins[i].range0start = type->ColorRangeStart;
		skins[i].range0end = type->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (type)->Scale;
	}

	R_InitSpriteDefs ();
	R_InitVoxels();		// [RH] Parse VOXELDEF
	NumStdSprites = sprites.Size();
	R_InitSkins ();		// [RH] Finish loading skin data

	// [RH] Set up base skin
	// [GRB] Each player class has its own base skin
	for (i = 0; i < PlayerClasses.Size (); i++)
	{
		PClassPlayerPawn *basetype = PlayerClasses[i].Type;
		FString classface = basetype->Face;

		strcpy (skins[i].name, "Base");
		if (classface.IsEmpty() || strcmp(classface, "None") == 0)
		{
			skins[i].face[0] = 'S';
			skins[i].face[1] = 'T';
			skins[i].face[2] = 'F';
			skins[i].face[3] = '\0';
		}
		else
		{
			strcpy(skins[i].face, classface);
		}
		skins[i].range0start = basetype->ColorRangeStart;
		skins[i].range0end = basetype->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (basetype)->Scale;
		skins[i].sprite = GetDefaultByType (basetype)->SpawnState->sprite;
		skins[i].namespc = ns_global;

		PlayerClasses[i].Skins.Push (i);

		if (memcmp (sprites[skins[i].sprite].name, "PLAY", 4) == 0)
		{
			for (j = 0; j < sprites.Size (); j++)
			{
				if (memcmp (sprites[j].name, deh.PlayerSprite, 4) == 0)
				{
					skins[i].sprite = (int)j;
					break;
				}
			}
		}
	}

	// [RH] Sort the skins, but leave base as skin 0
	//qsort (&skins[PlayerClasses.Size ()], numskins-PlayerClasses.Size (), sizeof(FPlayerSkin), skinsorter);

}